

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDA.cpp
# Opt level: O0

string * __thiscall
Transition::getStackInput_abi_cxx11_(string *__return_storage_ptr__,Transition *this)

{
  Transition *this_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->stackInput);
  return __return_storage_ptr__;
}

Assistant:

std::string Transition::getStackInput() const {
    return stackInput;
}